

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

UnlockNode * __thiscall GraphBuilder::addNode<UnlockNode>(GraphBuilder *this,UnlockNode *node)

{
  bool bVar1;
  Node *in_RSI;
  UnlockNode **in_RDI;
  pair<std::__detail::_Node_iterator<Node_*,_true,_false>,_bool> pVar2;
  Node *in_stack_ffffffffffffff68;
  value_type *__x;
  unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
  *in_stack_ffffffffffffff80;
  Node *local_8;
  
  __x = (value_type *)(in_RDI + 0x32);
  Node::callInstruction(in_stack_ffffffffffffff68);
  std::
  unordered_map<llvm::CallInst_const*,UnlockNode*,std::hash<llvm::CallInst_const*>,std::equal_to<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,UnlockNode*>>>
  ::emplace<llvm::CallInst_const*,UnlockNode*&>
            ((unordered_map<const_llvm::CallInst_*,_UnlockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>_>
              *)in_stack_ffffffffffffff80,(CallInst **)__x,in_RDI);
  bVar1 = Node::isArtificial(in_RSI);
  if (bVar1) {
    pVar2 = std::
            unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
            ::insert((unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
                      *)in_stack_ffffffffffffff80,__x);
  }
  else {
    Node::llvmInstruction(in_RSI);
    pVar2 = (pair<std::__detail::_Node_iterator<Node_*,_true,_false>,_bool>)
            std::
            unordered_map<llvm::Instruction_const*,Node*,std::hash<llvm::Instruction_const*>,std::equal_to<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>>
            ::emplace<llvm::Instruction_const*,UnlockNode*&>
                      (in_stack_ffffffffffffff80,(Instruction **)__x,in_RDI);
  }
  local_8 = in_RSI;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_8 = (Node *)0x0;
  }
  return (UnlockNode *)local_8;
}

Assistant:

UnlockNode *GraphBuilder::addNode(UnlockNode *node) {
    llvmToUnlocks_.emplace(node->callInstruction(), node);
    if (node->isArtificial()) {
        if (this->artificialNodes_.insert(node).second) {
            return node;
        }
    } else {
        if (this->llvmToNodeMap_.emplace(node->llvmInstruction(), node)
                    .second) {
            return node;
        }
    }

    return nullptr;
}